

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NumberPragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NumberPragmaExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  NumberPragmaExpressionSyntax *pNVar16;
  
  pNVar16 = (NumberPragmaExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NumberPragmaExpressionSyntax *)this->endPtr < pNVar16 + 1) {
    pNVar16 = (NumberPragmaExpressionSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pNVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pNVar16->super_PragmaExpressionSyntax).super_SyntaxNode.kind = NumberPragmaExpression;
  (pNVar16->super_PragmaExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar16->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pNVar16->size).kind = TVar4;
  (pNVar16->size).field_0x2 = uVar5;
  (pNVar16->size).numFlags = (NumericTokenFlags)NVar6.raw;
  (pNVar16->size).rawLen = uVar7;
  (pNVar16->size).info = pIVar1;
  (pNVar16->base).kind = TVar8;
  (pNVar16->base).field_0x2 = uVar9;
  (pNVar16->base).numFlags = (NumericTokenFlags)NVar10.raw;
  (pNVar16->base).rawLen = uVar11;
  (pNVar16->base).info = pIVar2;
  (pNVar16->value).kind = TVar12;
  (pNVar16->value).field_0x2 = uVar13;
  (pNVar16->value).numFlags = (NumericTokenFlags)NVar14.raw;
  (pNVar16->value).rawLen = uVar15;
  (pNVar16->value).info = pIVar3;
  return pNVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }